

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDLAddr12Len8Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  ulong uVar1;
  uint local_44;
  uint64_t Disp;
  uint64_t Base;
  uint64_t Length;
  uint *Regs_local;
  uint64_t Field_local;
  MCInst *Inst_local;
  
  uVar1 = Field >> 0xc & 0xf;
  if (uVar1 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = Regs[uVar1];
  }
  MCOperand_CreateReg0(Inst,local_44);
  MCOperand_CreateImm0(Inst,Field & 0xfff);
  MCOperand_CreateImm0(Inst,(Field >> 0x10) + 1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDLAddr12Len8Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Length = Field >> 16;
	uint64_t Base = (Field >> 12) & 0xf;
	uint64_t Disp = Field & 0xfff;
	//assert(Length < 256 && "Invalid BDLAddr12Len8");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);
	MCOperand_CreateImm0(Inst, Length + 1);

	return MCDisassembler_Success;
}